

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall Assimp::LWO::AnimResolver::ExtractBindPose(AnimResolver *this,aiMatrix4x4 *out)

{
  bool bVar1;
  reference pvVar2;
  aiMatrix4x4t<float> local_2bc;
  aiMatrix4x4t<float> local_27c;
  aiMatrix4x4t<float> local_23c;
  aiMatrix4x4t<float> local_1fc;
  undefined1 local_1bc [8];
  aiMatrix4x4 t;
  aiMatrix4x4 rz;
  aiMatrix4x4 ry;
  aiMatrix4x4 rx;
  aiMatrix4x4 s;
  aiVector3D translation;
  aiVector3D scaling;
  aiVector3D angles;
  aiMatrix4x4 *out_local;
  AnimResolver *this_local;
  
  bVar1 = std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::empty
                    (this->envelopes);
  if (bVar1) {
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&angles.y);
    memcpy(out,&angles.y,0x40);
  }
  else {
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&scaling.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&translation.y,1.0,1.0,1.0);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&s.d3);
    if (this->trans_x != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->trans_x->keys,0);
      s.d3 = pvVar2->value;
    }
    if (this->trans_y != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->trans_y->keys,0);
      s.d4 = pvVar2->value;
    }
    if (this->trans_z != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->trans_z->keys,0);
      translation.x = pvVar2->value;
    }
    if (this->rotat_x != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->rotat_x->keys,0);
      scaling.y = pvVar2->value;
    }
    if (this->rotat_y != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->rotat_y->keys,0);
      scaling.z = pvVar2->value;
    }
    if (this->rotat_z != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->rotat_z->keys,0);
      angles.x = pvVar2->value;
    }
    if (this->scale_x != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->scale_x->keys,0);
      translation.y = pvVar2->value;
    }
    if (this->scale_y != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->scale_y->keys,0);
      translation.z = pvVar2->value;
    }
    if (this->scale_z != (Envelope *)0x0) {
      pvVar2 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::operator[]
                         (&this->scale_z->keys,0);
      scaling.x = pvVar2->value;
    }
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&rx.d3);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&ry.d3);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&rz.d3);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&t.d3);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_1bc);
    aiMatrix4x4t<float>::RotationZ(angles.x,(aiMatrix4x4t<float> *)&t.d3);
    aiMatrix4x4t<float>::RotationX(scaling.z,(aiMatrix4x4t<float> *)&ry.d3);
    aiMatrix4x4t<float>::RotationY(scaling.y,(aiMatrix4x4t<float> *)&rz.d3);
    aiMatrix4x4t<float>::Translation((aiVector3t<float> *)&s.d3,(aiMatrix4x4t<float> *)local_1bc);
    aiMatrix4x4t<float>::Scaling((aiVector3t<float> *)&translation.y,(aiMatrix4x4t<float> *)&rx.d3);
    aiMatrix4x4t<float>::operator*
              (&local_2bc,(aiMatrix4x4t<float> *)local_1bc,(aiMatrix4x4t<float> *)&rz.d3);
    aiMatrix4x4t<float>::operator*(&local_27c,&local_2bc,(aiMatrix4x4t<float> *)&ry.d3);
    aiMatrix4x4t<float>::operator*(&local_23c,&local_27c,(aiMatrix4x4t<float> *)&t.d3);
    aiMatrix4x4t<float>::operator*(&local_1fc,&local_23c,(aiMatrix4x4t<float> *)&rx.d3);
    memcpy(out,&local_1fc,0x40);
  }
  return;
}

Assistant:

void AnimResolver::ExtractBindPose(aiMatrix4x4& out)
{
    // If we have no envelopes, return identity
    if (envelopes.empty()) {
        out = aiMatrix4x4();
        return;
    }
    aiVector3D angles, scaling(1.f,1.f,1.f), translation;

    if (trans_x) translation.x = trans_x->keys[0].value;
    if (trans_y) translation.y = trans_y->keys[0].value;
    if (trans_z) translation.z = trans_z->keys[0].value;

    if (rotat_x) angles.x = rotat_x->keys[0].value;
    if (rotat_y) angles.y = rotat_y->keys[0].value;
    if (rotat_z) angles.z = rotat_z->keys[0].value;

    if (scale_x) scaling.x = scale_x->keys[0].value;
    if (scale_y) scaling.y = scale_y->keys[0].value;
    if (scale_z) scaling.z = scale_z->keys[0].value;

    // build the final matrix
    aiMatrix4x4 s,rx,ry,rz,t;
    aiMatrix4x4::RotationZ(angles.z, rz);
    aiMatrix4x4::RotationX(angles.y, rx);
    aiMatrix4x4::RotationY(angles.x, ry);
    aiMatrix4x4::Translation(translation,t);
    aiMatrix4x4::Scaling(scaling,s);
    out = t*ry*rx*rz*s;
}